

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::VariableNameLengthValidator::validateNameLength
          (VariableNameLengthValidator *this,string *implementationName,GLint propValue)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  allocator<char> local_351;
  string local_350;
  MessageBuilder local_330;
  int local_1b0 [4];
  MessageBuilder local_1a0;
  int local_20;
  GLint local_1c;
  int expected;
  GLint propValue_local;
  string *implementationName_local;
  VariableNameLengthValidator *this_local;
  
  local_1c = propValue;
  _expected = implementationName;
  implementationName_local = (string *)this;
  local_20 = std::__cxx11::string::length();
  local_20 = local_20 + 1;
  pTVar1 = tcu::TestContext::getLog
                     ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1a0,(char (*) [34])"Verifying name length, expecting ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_20);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2afcbee);
  local_1b0[0] = std::__cxx11::string::length();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x2c15b5d);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,_expected);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [43])"\" + 1 byte for terminating null character)");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  if (local_1c != local_20) {
    pTVar1 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_330,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_330,(char (*) [34])"\tError, invalid name length, got ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1c);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_330);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"name length invalid",&local_351);
    PropValidator::setError((PropValidator *)this,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
  }
  return;
}

Assistant:

void VariableNameLengthValidator::validateNameLength (const std::string& implementationName, glw::GLint propValue) const
{
	const int expected = (int)implementationName.length() + 1; // includes null byte
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying name length, expecting " << expected << " (" << (int)implementationName.length() << " for \"" << implementationName << "\" + 1 byte for terminating null character)" << tcu::TestLog::EndMessage;

	if (propValue != expected)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid name length, got " << propValue << tcu::TestLog::EndMessage;
		setError("name length invalid");
	}
}